

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_signature.hpp
# Opt level: O0

void chaiscript::dispatch::detail::
     function_signature<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)>
               (offset_in_Dynamic_Object_to_subr *f)

{
  offset_in_Dynamic_Object_to_subr *f_local;
  
  Function_Signature<chaiscript::Boxed_Value&,chaiscript::dispatch::detail::Function_Params<chaiscript::dispatch::Dynamic_Object&,std::__cxx11::string_const&>,false,true,false,false>
  ::
  Function_Signature<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*const&)(std::__cxx11::string_const&)>
            ((Function_Signature<chaiscript::Boxed_Value&,chaiscript::dispatch::detail::Function_Params<chaiscript::dispatch::Dynamic_Object&,std::__cxx11::string_const&>,false,true,false,false>
              *)((long)&f_local + 7),f);
  return;
}

Assistant:

auto function_signature(const Func &f) {
    if constexpr (has_call_operator<Func>::value) {
      return Function_Signature<typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Return_Type,
                                typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Param_Types,
                                decltype(Function_Signature{&std::decay_t<Func>::operator()})::is_noexcept,
                                false,
                                false,
                                true>{};
    } else {
      return Function_Signature{f};
    }
  }